

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::
     BuiltinDeserializer<std::shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>,_void>
     ::deserialize<InputStream>
               (shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_> *opt,
               InputStream *istream)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *__p;
  uint8_t discriminator;
  uint32_t size;
  char local_1d;
  undefined4 local_1c;
  
  std::istream::read((char *)istream->stream,(long)&local_1d);
  if (local_1d == '\0') {
    this = (opt->
           super___shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
    (opt->
    super___shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = (element_type *)0x0;
    (opt->
    super___shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  else {
    __p = (vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *)operator_new(0x18);
    (__p->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    __shared_ptr<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>,(__gnu_cxx::_Lock_policy)2>
    ::reset<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>
              ((__shared_ptr<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>,(__gnu_cxx::_Lock_policy)2>
                *)opt,__p);
    peVar1 = (opt->
             super___shared_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    std::istream::read((char *)istream->stream,(long)&local_1c);
    BuiltinDeserializer<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_void>::
    deserialize_elems<InputStream>(peVar1,local_1c,istream);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }